

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

int If_CluDetectSpecialCaseCofs(word *pF,int nVars,int iVar)

{
  uint uVar1;
  long lVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  word *pwVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  ulong local_40;
  int local_34;
  
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uVar1 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar1 = 1;
  }
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifDec16.c"
                  ,0x41b,"int If_CluDetectSpecialCaseCofs(word *, int, int)");
  }
  if (iVar < 6) {
    if ((int)uVar1 < 1) {
      uVar9 = 0;
      iVar11 = 0;
    }
    else {
      uVar10 = ~Truth6[iVar];
      uVar13 = 0;
      uVar5 = 0;
      iVar7 = 0;
      iVar14 = 0;
      iVar8 = 0;
      uVar9 = 0;
      iVar11 = 0;
      do {
        uVar4 = (Truth6[iVar] & pF[uVar13]) >> ((byte)(1 << ((byte)iVar & 0x1f)) & 0x3f);
        uVar12 = pF[uVar13] & uVar10;
        if (uVar12 == 0) {
          iVar11 = iVar11 + 1;
        }
        else if (uVar12 == uVar10) {
          uVar5 = uVar5 + 1;
        }
        else if (uVar4 == 0) {
          iVar7 = iVar7 + 1;
        }
        else if (uVar4 == uVar10) {
          iVar14 = iVar14 + 1;
        }
        else if ((uVar4 ^ uVar12) == 0xffffffffffffffff) {
          iVar8 = iVar8 + 1;
        }
        else {
          uVar9 = uVar9 + (uVar12 == uVar4);
        }
        uVar13 = uVar13 + 1;
      } while (uVar1 != uVar13);
      local_48 = CONCAT44(uVar9,iVar8);
      uStack_50 = CONCAT44(iVar14,iVar7);
      local_58 = (ulong)uVar5 << 0x20;
    }
    local_58 = CONCAT44(local_58._4_4_,iVar11);
  }
  else {
    if ((int)uVar1 < 1) {
      uVar9 = 0;
      iVar11 = 0;
    }
    else {
      bVar3 = (byte)(iVar + -6);
      uVar9 = 1 << (bVar3 & 0x1f);
      local_34 = 2 << (bVar3 & 0x1f);
      uVar10 = 1;
      if (1 < (int)uVar9) {
        uVar10 = (ulong)uVar9;
      }
      pwVar6 = pF + (int)uVar9;
      local_40 = 0;
      uVar9 = 0;
      iVar7 = 0;
      iVar14 = 0;
      uVar5 = 0;
      iVar8 = 0;
      iVar11 = 0;
      do {
        if (iVar + -6 != 0x1f) {
          uVar13 = 0;
          do {
            uVar4 = pF[uVar13];
            if (uVar4 == 0xffffffffffffffff) {
              uVar5 = uVar5 + 1;
            }
            else if (uVar4 == 0) {
              iVar11 = iVar11 + 1;
            }
            else {
              uVar12 = pwVar6[uVar13];
              if (uVar12 == 0xffffffffffffffff) {
                iVar14 = iVar14 + 1;
              }
              else if (uVar12 == 0) {
                iVar7 = iVar7 + 1;
              }
              else if ((uVar12 ^ uVar4) == 0xffffffffffffffff) {
                local_40 = (ulong)((int)local_40 + 1);
              }
              else {
                uVar9 = uVar9 + (uVar4 == uVar12);
              }
            }
            uVar13 = uVar13 + 1;
          } while (uVar10 != uVar13);
        }
        iVar8 = iVar8 + local_34;
        pwVar6 = pwVar6 + local_34;
        pF = pF + local_34;
      } while (iVar8 < (int)uVar1);
      local_58 = (ulong)uVar5 << 0x20;
      uStack_50 = CONCAT44(iVar14,iVar7);
      local_48 = CONCAT44(uVar9,(int)local_40);
    }
    local_58 = CONCAT44(local_58._4_4_,iVar11);
    uVar1 = (int)uVar1 / 2;
  }
  if (uVar9 == uVar1) {
    __assert_fail("State[5] != nWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifDec16.c"
                  ,0x44d,"int If_CluDetectSpecialCaseCofs(word *, int, int)");
  }
  lVar2 = 0;
  do {
    uVar9 = *(uint *)((long)&local_58 + lVar2 * 4);
    if (uVar9 != uVar1 && (int)uVar1 <= (int)uVar9) {
      __assert_fail("State[i] <= nWords",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifDec16.c"
                    ,0x450,"int If_CluDetectSpecialCaseCofs(word *, int, int)");
    }
    if (uVar9 == uVar1) goto LAB_003eeb9a;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  lVar2 = 0xffffffff;
LAB_003eeb9a:
  return (int)lVar2;
}

Assistant:

int If_CluDetectSpecialCaseCofs( word * pF, int nVars, int iVar )
{
    word Cof0, Cof1;
    int State[6] = {0};
    int i, nWords = If_CluWordNum( nVars );
    assert( iVar < nVars );
    if ( iVar < 6 )
    {
        int Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
        {
            Cof0 =  (pF[i] & ~Truth6[iVar]);
            Cof1 = ((pF[i] &  Truth6[iVar]) >> Shift);

            if ( Cof0 == 0 )
                State[0]++;
            else if ( Cof0 == ~Truth6[iVar] )
                State[1]++;
            else if ( Cof1 == 0 )
                State[2]++;
            else if ( Cof1 == ~Truth6[iVar] )
                State[3]++;
            else if ( Cof0 == ~Cof1 )
                State[4]++;
            else if ( Cof0 == Cof1 )
                State[5]++;
        }
    }
    else
    {
        int k, Step = (1 << (iVar - 6));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
            {
                Cof0 = pF[i];
                Cof1 = pF[Step+i];

                if ( Cof0 == 0 )
                    State[0]++;
                else if ( Cof0 == ~(word)0 )
                    State[1]++;
                else if ( Cof1 == 0 )
                    State[2]++;
                else if ( Cof1 == ~(word)0 )
                    State[3]++;
                else if ( Cof0 == ~Cof1 )
                    State[4]++;
                else if ( Cof0 == Cof1 )
                    State[5]++;
            }
            pF    += 2*Step;
        }
        nWords /= 2;
    }
    assert( State[5] != nWords );
    for ( i = 0; i < 5; i++ )
    {
        assert( State[i] <= nWords );
        if ( State[i] == nWords )
            return i;
    }
    return -1;
}